

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O0

void verify_stale_block_reuse_test(void)

{
  fdb_status fVar1;
  char *pcVar2;
  void *__s;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined4 uVar8;
  undefined1 auVar7 [16];
  fdb_status s_10;
  fdb_status s_9;
  fdb_status s_8;
  fdb_status s_7;
  fdb_status s_6;
  fdb_status s_5;
  fdb_status s_4;
  fdb_file_info file_info;
  fdb_status s_3;
  fdb_status s_2;
  char *key;
  char *val;
  size_t valuesize;
  fdb_status s_1;
  fdb_status s;
  size_t fileSize2;
  size_t fileSize1;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_kvs_handle *lazy;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffcf8;
  FILE *pFVar9;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  size_t in_stack_fffffffffffffd18;
  void *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  fdb_file_info *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  undefined8 local_1e0;
  fdb_kvs_config *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  fdb_kvs_handle **in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 uVar10;
  fdb_config *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  fdb_file_handle **in_stack_ffffffffffffff28;
  int local_54;
  timeval local_10;
  undefined1 auVar6 [16];
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  staleblktest* > errorlog.txt");
  uVar10 = 0;
  fVar1 = fdb_open(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pFVar9 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar9,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x39);
    verify_stale_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x39,"void verify_stale_block_reuse_test()");
  }
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)
                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                     &in_stack_fffffffffffffcf8->root,(fdb_kvs_config *)0x104207);
  pFVar9 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar9,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x3b);
    verify_stale_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x3b,"void verify_stale_block_reuse_test()");
  }
  __s = operator_new__(0x2800);
  memset(__s,0,0x2800);
  for (local_54 = 0; local_54 < 3000; local_54 = local_54 + 2) {
    strlen("key");
    fVar1 = fdb_set_kv((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                       in_stack_fffffffffffffd30,
                       CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                       in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    pFVar9 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar9,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x43);
      verify_stale_block_reuse_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x43,"void verify_stale_block_reuse_test()");
    }
    if (((local_54 + 1) % 100 == 0) &&
       (fVar1 = fdb_commit(in_stack_fffffffffffffcf8,'\0'), pFVar9 = _stderr,
       fVar1 != FDB_RESULT_SUCCESS)) {
      pcVar2 = fdb_error_msg(fVar1);
      fprintf(pFVar9,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x47);
      verify_stale_block_reuse_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x47,"void verify_stale_block_reuse_test()");
    }
  }
  fVar1 = fdb_get_file_info((fdb_file_handle *)
                            CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                            in_stack_fffffffffffffd30);
  pFVar9 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar9,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x4d);
    verify_stale_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x4d,"void verify_stale_block_reuse_test()");
  }
  fVar1 = fdb_kvs_open((fdb_file_handle *)CONCAT17(uVar10,in_stack_fffffffffffffeb8),
                       in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0
                      );
  pFVar9 = _stderr;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    local_54 = 0;
    while( true ) {
      if (999 < local_54) {
        fVar1 = fdb_get_file_info((fdb_file_handle *)
                                  CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                  in_stack_fffffffffffffd30);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          pFVar9 = _stderr;
          pcVar2 = fdb_error_msg(fVar1);
          fprintf(pFVar9,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x5e);
          verify_stale_block_reuse_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x5e,"void verify_stale_block_reuse_test()");
        }
        uVar8 = (undefined4)((ulong)local_1e0 >> 0x20);
        auVar6._8_4_ = uVar8;
        auVar6._0_8_ = local_1e0;
        auVar6._12_4_ = 0x45300000;
        uVar5 = (undefined4)local_1e0;
        auVar3._8_4_ = uVar8;
        auVar3._0_8_ = local_1e0;
        auVar3._12_4_ = 0x45300000;
        if (((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,uVar5) - 4503599627370496.0)) * 1.3 <=
            (auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,uVar5) - 4503599627370496.0)) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x61);
          verify_stale_block_reuse_test::__test_pass = 0;
          auVar7._8_4_ = uVar8;
          auVar7._0_8_ = local_1e0;
          auVar7._12_4_ = 0x45300000;
          auVar4._8_4_ = uVar8;
          auVar4._0_8_ = local_1e0;
          auVar4._12_4_ = 0x45300000;
          if (((auVar4._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,uVar5) - 4503599627370496.0)) * 1.3 <=
              (auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,uVar5) - 4503599627370496.0)) {
            __assert_fail("double(fileSize2) < double(fileSize1) * 1.3",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                          ,0x61,"void verify_stale_block_reuse_test()");
          }
        }
        if (__s != (void *)0x0) {
          operator_delete__(__s);
        }
        fVar1 = fdb_close(in_stack_fffffffffffffcf8);
        pFVar9 = _stderr;
        if (fVar1 == FDB_RESULT_SUCCESS) {
          fVar1 = fdb_shutdown();
          if (fVar1 == FDB_RESULT_SUCCESS) {
            if (verify_stale_block_reuse_test::__test_pass == 0) {
              fprintf(_stderr,"%s FAILED\n","basic stale block reuse test");
            }
            else {
              fprintf(_stderr,"%s PASSED\n","basic stale block reuse test");
            }
            return;
          }
          pFVar9 = _stderr;
          pcVar2 = fdb_error_msg(fVar1);
          fprintf(pFVar9,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x68);
          verify_stale_block_reuse_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x68,"void verify_stale_block_reuse_test()");
        }
        pcVar2 = fdb_error_msg(fVar1);
        fprintf(pFVar9,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x66);
        verify_stale_block_reuse_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x66,"void verify_stale_block_reuse_test()");
      }
      strlen("key");
      fVar1 = fdb_set_kv((fdb_kvs_handle *)
                         CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                         in_stack_fffffffffffffd30,
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                         in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      pFVar9 = _stderr;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcVar2 = fdb_error_msg(fVar1);
        fprintf(pFVar9,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x58);
        verify_stale_block_reuse_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x58,"void verify_stale_block_reuse_test()");
      }
      fVar1 = fdb_commit(in_stack_fffffffffffffcf8,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) break;
      local_54 = local_54 + 1;
    }
    pFVar9 = _stderr;
    pcVar2 = fdb_error_msg(fVar1);
    fprintf(pFVar9,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x5a);
    verify_stale_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x5a,"void verify_stale_block_reuse_test()");
  }
  pcVar2 = fdb_error_msg(fVar1);
  fprintf(pFVar9,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar2,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x52);
  verify_stale_block_reuse_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x52,"void verify_stale_block_reuse_test()");
}

Assistant:

void verify_stale_block_reuse_test() {
    TEST_INIT();

    int i, r;
    fdb_file_handle* dbfile;
    fdb_kvs_handle* db, *lazy;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    size_t fileSize1, fileSize2;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    // init
    fconfig.compaction_threshold = 0;

    fconfig.block_reusing_threshold = 20;
    status = fdb_open(&dbfile, (char *)"./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_STATUS(status);

    size_t valuesize = 10240; // 10K buffer
    char *val = new char[valuesize]();
    const char *key = "key";
    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    for (i = 0; i < 3000; ++i) { // 3000 * 10K
        status = fdb_set_kv(db, key, strlen(key) + 1, val, valuesize);
        TEST_STATUS(status);
        i++;
        if (!(i % 100)) { // commit 30 times
            status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
            TEST_STATUS(status);
        }
    }

    fdb_file_info file_info;
    status = fdb_get_file_info(dbfile, &file_info);
    TEST_STATUS(status);
    fileSize1 = file_info.file_size; // record file size first

    // open a 'lazy' handle that does not issue any forestdb calls..
    status = fdb_kvs_open(dbfile, &lazy, "lazy", &kvs_config);
    TEST_STATUS(status);

    // 100 commits which should all reuse stale blocks
    for (i = 0; i < 1000; ++i) {
        status = fdb_set_kv(db, key, strlen(key) + 1,
                            val, 10);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    status = fdb_get_file_info(dbfile, &file_info);
    TEST_STATUS(status);
    fileSize2 = file_info.file_size; // record file size first
    // ensure file size has not exploded and is within 30% of original filesize
    TEST_CHK(double(fileSize2) < double(fileSize1) * 1.3);

    // cleanup
    delete [] val;
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    status = fdb_shutdown();
    TEST_STATUS(status);

    TEST_RESULT("basic stale block reuse test");
}